

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

void cram_ref_decr_locked(refs_t *r,int id)

{
  long lVar1;
  int id_local;
  refs_t *r_local;
  
  if ((id < 0) || (r->ref_id[id]->seq == (char *)0x0)) {
    if (r->ref_id[id]->count < 0) {
      __assert_fail("r->ref_id[id]->count >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                    ,0x826,"void cram_ref_decr_locked(refs_t *, int)");
    }
  }
  else {
    lVar1 = r->ref_id[id]->count + -1;
    r->ref_id[id]->count = lVar1;
    if (lVar1 < 1) {
      if (r->ref_id[id]->count != 0) {
        __assert_fail("r->ref_id[id]->count == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                      ,0x82b,"void cram_ref_decr_locked(refs_t *, int)");
      }
      if (((-1 < r->last_id) && (r->ref_id[r->last_id]->count < 1)) &&
         (r->ref_id[r->last_id]->seq != (char *)0x0)) {
        free(r->ref_id[r->last_id]->seq);
        r->ref_id[r->last_id]->seq = (char *)0x0;
        r->ref_id[r->last_id]->length = 0;
      }
      r->last_id = id;
    }
  }
  return;
}

Assistant:

static void cram_ref_decr_locked(refs_t *r, int id) {
    RP("%d DEC REF %d, %d %p\n", gettid(), id, (int)(id>=0?r->ref_id[id]->count-1:-999), id>=0?r->ref_id[id]->seq:(char *)1);

    if (id < 0 || !r->ref_id[id]->seq) {
	assert(r->ref_id[id]->count >= 0);
	return;
    }

    if (--r->ref_id[id]->count <= 0) {
	assert(r->ref_id[id]->count == 0);
	if (r->last_id >= 0) {
	    if (r->ref_id[r->last_id]->count <= 0 &&
		r->ref_id[r->last_id]->seq) {
		RP("%d FREE REF %d (%p)\n", gettid(),
		   r->last_id, r->ref_id[r->last_id]->seq);
		free(r->ref_id[r->last_id]->seq);
		r->ref_id[r->last_id]->seq = NULL;
		r->ref_id[r->last_id]->length = 0;
	    }
	}
	r->last_id = id;
    }
}